

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * google::protobuf::anon_unknown_1::ToJsonName(string *__return_storage_ptr__,string *input)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  undefined4 local_30;
  int i;
  bool capitalize_next;
  string *input_local;
  string *result;
  
  bVar1 = false;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_30 = 0; uVar2 = std::__cxx11::string::size(), (ulong)(long)local_30 < uVar2;
      local_30 = local_30 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if (*pcVar3 == '_') {
      bVar1 = true;
    }
    else if (bVar1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
      ToUpper(*pcVar3);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      bVar1 = false;
    }
    else {
      std::__cxx11::string::operator[]((ulong)input);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string ToJsonName(const string& input) {
  bool capitalize_next = false;
  string result;
  result.reserve(input.size());

  for (int i = 0; i < input.size(); i++) {
    if (input[i] == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpper(input[i]));
      capitalize_next = false;
    } else {
      result.push_back(input[i]);
    }
  }

  return result;
}